

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

uint32_t spvtools::opt::anon_unknown_0::PerformIntegerOperation
                   (ConstantManager *const_mgr,Op opcode,Constant *input1,Constant *input2)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Type *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint64_t uVar6;
  Constant *c;
  Instruction *this;
  Constant *merged_const;
  undefined1 local_c0 [4];
  uint32_t val_5;
  uint64_t local_a8;
  uint64_t val_4;
  undefined1 local_98 [4];
  uint32_t val_3;
  uint64_t local_80;
  uint64_t val_2;
  undefined1 local_70 [4];
  uint32_t val_1;
  uint64_t local_58;
  uint64_t val;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  uint32_t width;
  Integer *type;
  Constant *input2_local;
  Constant *input1_local;
  Op opcode_local;
  ConstantManager *const_mgr_local;
  
  pTVar5 = analysis::Constant::type(input1);
  iVar1 = (*pTVar5->_vptr_Type[10])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    __assert_fail("input1->type()->AsInteger()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x259,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformIntegerOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  }
  pTVar5 = analysis::Constant::type(input1);
  iVar1 = (*pTVar5->_vptr_Type[10])();
  iVar2 = (*((Type *)CONCAT44(extraout_var_00,iVar1))->_vptr_Type[10])();
  words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ =
       analysis::Integer::width((Integer *)CONCAT44(extraout_var_01,iVar2));
  if (words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ == 0x20 ||
      words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ == 0x40) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val);
    switch(opcode) {
    case OpIAdd:
      if (words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ == 0x40) {
        uVar6 = analysis::Constant::GetU64(input1);
        local_80 = analysis::Constant::GetU64(input2);
        local_80 = uVar6 + local_80;
        ExtractInts((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98,local_80);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
      }
      else {
        uVar4 = analysis::Constant::GetU32(input1);
        uVar3 = analysis::Constant::GetU32(input2);
        val_4._4_4_ = uVar4 + uVar3;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val,
                   (value_type_conflict2 *)((long)&val_4 + 4));
      }
      break;
    default:
      __assert_fail("false && \"Unexpected operation\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0x27a,
                    "uint32_t spvtools::opt::(anonymous namespace)::PerformIntegerOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                   );
    case OpISub:
      if (words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ == 0x40) {
        uVar6 = analysis::Constant::GetU64(input1);
        local_a8 = analysis::Constant::GetU64(input2);
        local_a8 = uVar6 - local_a8;
        ExtractInts((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0,local_a8);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0);
      }
      else {
        uVar4 = analysis::Constant::GetU32(input1);
        uVar3 = analysis::Constant::GetU32(input2);
        merged_const._4_4_ = uVar4 - uVar3;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val,
                   (value_type_conflict2 *)((long)&merged_const + 4));
      }
      break;
    case OpIMul:
      if (words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ == 0x40) {
        uVar6 = analysis::Constant::GetU64(input1);
        local_58 = analysis::Constant::GetU64(input2);
        local_58 = uVar6 * local_58;
        ExtractInts((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,local_58);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
      }
      else {
        uVar4 = analysis::Constant::GetU32(input1);
        uVar3 = analysis::Constant::GetU32(input2);
        val_2._4_4_ = uVar4 * uVar3;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val,
                   (value_type_conflict2 *)((long)&val_2 + 4));
      }
      break;
    case OpUDiv:
    case OpSDiv:
      __assert_fail("false && \"Should not merge integer division\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0x271,
                    "uint32_t spvtools::opt::(anonymous namespace)::PerformIntegerOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                   );
    }
    c = analysis::ConstantManager::GetConstant
                  (const_mgr,(Type *)CONCAT44(extraout_var_00,iVar1),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val);
    this = analysis::ConstantManager::GetDefiningInstruction(const_mgr,c,0,(inst_iterator *)0x0);
    uVar4 = Instruction::result_id(this);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val);
    return uVar4;
  }
  __assert_fail("width == 32 || width == 64",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                ,0x25c,
                "uint32_t spvtools::opt::(anonymous namespace)::PerformIntegerOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
               );
}

Assistant:

uint32_t PerformIntegerOperation(analysis::ConstantManager* const_mgr,
                                 spv::Op opcode,
                                 const analysis::Constant* input1,
                                 const analysis::Constant* input2) {
  assert(input1->type()->AsInteger());
  const analysis::Integer* type = input1->type()->AsInteger();
  uint32_t width = type->AsInteger()->width();
  assert(width == 32 || width == 64);
  std::vector<uint32_t> words;
  // Regardless of the sign of the constant, folding is performed on an unsigned
  // interpretation of the constant data. This avoids signed integer overflow
  // while folding, and works because sign is irrelevant for the IAdd, ISub and
  // IMul instructions.
#define FOLD_OP(op)                                      \
  if (width == 64) {                                     \
    uint64_t val = input1->GetU64() op input2->GetU64(); \
    words = ExtractInts(val);                            \
  } else {                                               \
    uint32_t val = input1->GetU32() op input2->GetU32(); \
    words.push_back(val);                                \
  }                                                      \
  static_assert(true, "require extra semicolon")
  switch (opcode) {
    case spv::Op::OpIMul:
      FOLD_OP(*);
      break;
    case spv::Op::OpSDiv:
    case spv::Op::OpUDiv:
      assert(false && "Should not merge integer division");
      break;
    case spv::Op::OpIAdd:
      FOLD_OP(+);
      break;
    case spv::Op::OpISub:
      FOLD_OP(-);
      break;
    default:
      assert(false && "Unexpected operation");
      break;
  }
#undef FOLD_OP
  const analysis::Constant* merged_const = const_mgr->GetConstant(type, words);
  return const_mgr->GetDefiningInstruction(merged_const)->result_id();
}